

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__horizontal_gather_7_channels_with_12_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float *pfVar110;
  long lVar111;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar110 = horizontal_coefficients + 8;
  do {
    lVar111 = (long)horizontal_contributors->n0;
    fVar14 = pfVar110[-8];
    fVar15 = pfVar110[-7];
    fVar16 = pfVar110[-6];
    fVar17 = pfVar110[-5];
    pfVar2 = decode_buffer + lVar111 * 7;
    fVar18 = *pfVar2;
    fVar19 = pfVar2[1];
    fVar20 = pfVar2[2];
    fVar21 = pfVar2[3];
    pfVar2 = decode_buffer + lVar111 * 7 + 3;
    fVar22 = pfVar2[1];
    fVar23 = pfVar2[2];
    fVar24 = pfVar2[3];
    pfVar3 = decode_buffer + lVar111 * 7 + 7;
    fVar25 = *pfVar3;
    fVar26 = pfVar3[1];
    fVar27 = pfVar3[2];
    fVar28 = pfVar3[3];
    pfVar3 = decode_buffer + lVar111 * 7 + 10;
    fVar29 = pfVar3[1];
    fVar30 = pfVar3[2];
    fVar31 = pfVar3[3];
    pfVar4 = decode_buffer + lVar111 * 7 + 0xe;
    fVar32 = *pfVar4;
    fVar33 = pfVar4[1];
    fVar34 = pfVar4[2];
    fVar35 = pfVar4[3];
    pfVar4 = decode_buffer + lVar111 * 7 + 0x11;
    fVar36 = pfVar4[1];
    fVar37 = pfVar4[2];
    fVar38 = pfVar4[3];
    pfVar5 = decode_buffer + lVar111 * 7 + 0x15;
    fVar39 = *pfVar5;
    fVar40 = pfVar5[1];
    fVar41 = pfVar5[2];
    fVar42 = pfVar5[3];
    pfVar5 = decode_buffer + lVar111 * 7 + 0x18;
    fVar43 = pfVar5[1];
    fVar44 = pfVar5[2];
    fVar45 = pfVar5[3];
    fVar46 = pfVar110[-4];
    fVar47 = pfVar110[-3];
    fVar48 = pfVar110[-2];
    fVar49 = pfVar110[-1];
    pfVar6 = decode_buffer + lVar111 * 7 + 0x1c;
    fVar50 = *pfVar6;
    fVar51 = pfVar6[1];
    fVar52 = pfVar6[2];
    fVar53 = pfVar6[3];
    pfVar6 = decode_buffer + lVar111 * 7 + 0x1f;
    fVar54 = pfVar6[1];
    fVar55 = pfVar6[2];
    fVar56 = pfVar6[3];
    pfVar7 = decode_buffer + lVar111 * 7 + 0x23;
    fVar57 = *pfVar7;
    fVar58 = pfVar7[1];
    fVar59 = pfVar7[2];
    fVar60 = pfVar7[3];
    pfVar7 = decode_buffer + lVar111 * 7 + 0x26;
    fVar61 = pfVar7[1];
    fVar62 = pfVar7[2];
    fVar63 = pfVar7[3];
    pfVar8 = decode_buffer + lVar111 * 7 + 0x2a;
    fVar64 = *pfVar8;
    fVar65 = pfVar8[1];
    fVar66 = pfVar8[2];
    fVar67 = pfVar8[3];
    pfVar8 = decode_buffer + lVar111 * 7 + 0x2d;
    fVar68 = pfVar8[1];
    fVar69 = pfVar8[2];
    fVar70 = pfVar8[3];
    pfVar9 = decode_buffer + lVar111 * 7 + 0x31;
    fVar71 = *pfVar9;
    fVar72 = pfVar9[1];
    fVar73 = pfVar9[2];
    fVar74 = pfVar9[3];
    pfVar9 = decode_buffer + lVar111 * 7 + 0x34;
    fVar75 = pfVar9[1];
    fVar76 = pfVar9[2];
    fVar77 = pfVar9[3];
    fVar78 = *pfVar110;
    fVar79 = pfVar110[1];
    fVar80 = pfVar110[2];
    fVar81 = pfVar110[3];
    pfVar10 = decode_buffer + lVar111 * 7 + 0x38;
    fVar82 = *pfVar10;
    fVar83 = pfVar10[1];
    fVar84 = pfVar10[2];
    fVar85 = pfVar10[3];
    pfVar10 = decode_buffer + lVar111 * 7 + 0x3b;
    fVar86 = pfVar10[1];
    fVar87 = pfVar10[2];
    fVar88 = pfVar10[3];
    pfVar11 = decode_buffer + lVar111 * 7 + 0x3f;
    fVar89 = *pfVar11;
    fVar90 = pfVar11[1];
    fVar91 = pfVar11[2];
    fVar92 = pfVar11[3];
    pfVar11 = decode_buffer + lVar111 * 7 + 0x42;
    fVar93 = pfVar11[1];
    fVar94 = pfVar11[2];
    fVar95 = pfVar11[3];
    pfVar12 = decode_buffer + lVar111 * 7 + 0x46;
    fVar96 = *pfVar12;
    fVar97 = pfVar12[1];
    fVar98 = pfVar12[2];
    fVar99 = pfVar12[3];
    pfVar12 = decode_buffer + lVar111 * 7 + 0x49;
    fVar100 = pfVar12[1];
    fVar101 = pfVar12[2];
    fVar102 = pfVar12[3];
    pfVar13 = decode_buffer + lVar111 * 7 + 0x4d;
    fVar103 = *pfVar13;
    fVar104 = pfVar13[1];
    fVar105 = pfVar13[2];
    fVar106 = pfVar13[3];
    pfVar13 = decode_buffer + lVar111 * 7 + 0x50;
    fVar107 = pfVar13[1];
    fVar108 = pfVar13[2];
    fVar109 = pfVar13[3];
    output_buffer[3] =
         *pfVar13 * fVar81 +
         fVar79 * *pfVar11 +
         *pfVar9 * fVar49 + fVar47 * *pfVar7 + *pfVar5 * fVar17 + fVar15 * *pfVar3 +
         *pfVar12 * fVar80 +
         *pfVar10 * fVar78 +
         *pfVar8 * fVar48 + *pfVar6 * fVar46 + *pfVar4 * fVar16 + *pfVar2 * fVar14;
    output_buffer[4] =
         fVar107 * fVar81 +
         fVar79 * fVar93 + fVar75 * fVar49 + fVar47 * fVar61 + fVar43 * fVar17 + fVar15 * fVar29 +
         fVar100 * fVar80 +
         fVar86 * fVar78 + fVar68 * fVar48 + fVar54 * fVar46 + fVar36 * fVar16 + fVar22 * fVar14;
    output_buffer[5] =
         fVar108 * fVar81 +
         fVar79 * fVar94 + fVar76 * fVar49 + fVar47 * fVar62 + fVar44 * fVar17 + fVar15 * fVar30 +
         fVar101 * fVar80 +
         fVar87 * fVar78 + fVar69 * fVar48 + fVar55 * fVar46 + fVar37 * fVar16 + fVar23 * fVar14;
    output_buffer[6] =
         fVar109 * fVar81 +
         fVar79 * fVar95 + fVar77 * fVar49 + fVar47 * fVar63 + fVar45 * fVar17 + fVar15 * fVar31 +
         fVar102 * fVar80 +
         fVar88 * fVar78 + fVar70 * fVar48 + fVar56 * fVar46 + fVar38 * fVar16 + fVar24 * fVar14;
    *output_buffer =
         fVar103 * fVar81 +
         fVar89 * fVar79 + fVar71 * fVar49 + fVar57 * fVar47 + fVar39 * fVar17 + fVar25 * fVar15 +
         fVar96 * fVar80 +
         fVar82 * fVar78 + fVar64 * fVar48 + fVar50 * fVar46 + fVar32 * fVar16 + fVar18 * fVar14;
    output_buffer[1] =
         fVar104 * fVar81 +
         fVar90 * fVar79 + fVar72 * fVar49 + fVar58 * fVar47 + fVar40 * fVar17 + fVar26 * fVar15 +
         fVar97 * fVar80 +
         fVar83 * fVar78 + fVar65 * fVar48 + fVar51 * fVar46 + fVar33 * fVar16 + fVar19 * fVar14;
    output_buffer[2] =
         fVar105 * fVar81 +
         fVar91 * fVar79 + fVar73 * fVar49 + fVar59 * fVar47 + fVar41 * fVar17 + fVar27 * fVar15 +
         fVar98 * fVar80 +
         fVar84 * fVar78 + fVar66 * fVar48 + fVar52 * fVar46 + fVar34 * fVar16 + fVar20 * fVar14;
    output_buffer[3] =
         fVar106 * fVar81 +
         fVar92 * fVar79 + fVar74 * fVar49 + fVar60 * fVar47 + fVar42 * fVar17 + fVar28 * fVar15 +
         fVar99 * fVar80 +
         fVar85 * fVar78 + fVar67 * fVar48 + fVar53 * fVar46 + fVar35 * fVar16 + fVar21 * fVar14;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar110 = pfVar110 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_12_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__4_coeff_continue_from_4(8);
    stbir__store_output();
  } while ( output < output_end );
}